

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void pre_out(c2m_ctx_t c2m_ctx,token_t t)

{
  undefined8 uVar1;
  char cVar2;
  token_t ptVar3;
  size_t sVar4;
  token_t ptVar5;
  undefined8 uVar6;
  char *pcVar7;
  int type;
  char cVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  str_t sVar12;
  pos_t pos;
  long local_38;
  
  if (t == (token_t)0x0) {
    ptVar3 = c2m_ctx->pre_ctx->pre_last_token;
    if (ptVar3 == (token_t)0x0) {
      uVar6 = 0xffffffffffffffff;
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (ptVar3->pos).fname;
      uVar6._0_4_ = (ptVar3->pos).lno;
      uVar6._4_4_ = (ptVar3->pos).ln_pos;
    }
    pos.lno = (int)uVar6;
    pos.ln_pos = (int)((ulong)uVar6 >> 0x20);
    pos.fname = pcVar10;
    ptVar3 = new_token(c2m_ctx,pos,"<EOF>",0x13d,N_IGNORE);
  }
  else {
    if ((*(short *)t == -1) || (*(short *)t == 0x147)) {
      __assert_fail("t->code != T_EOU && t->code != EOF",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
    }
    c2m_ctx->pre_ctx->pre_last_token = t;
    ptVar3 = pptoken2token(c2m_ctx,t,1);
    if (ptVar3 == (token_t)0x0) {
      return;
    }
  }
  if (((*(short *)ptVar3 != 0x102) ||
      (sVar4 = VARR_token_tlength(c2m_ctx->recorded_tokens), sVar4 == 0)) ||
     (ptVar5 = VARR_token_tlast(c2m_ctx->recorded_tokens), *(short *)ptVar5 != 0x102))
  goto LAB_00160037;
  ptVar5 = VARR_token_tpop(c2m_ctx->recorded_tokens);
  VARR_chartrunc(c2m_ctx->temp_string,0);
  pcVar10 = ptVar5->repr;
  cVar2 = *pcVar10;
  type = 0x4c;
  if ((cVar2 == 'L') || (cVar2 == 'U')) {
LAB_00160054:
    pcVar7 = ptVar3->repr;
    cVar8 = *pcVar7;
    if (cVar8 != '\"') {
      bVar11 = true;
      lVar9 = 1;
      if (cVar8 == cVar2) {
        bVar11 = pcVar7[1] == '8';
        cVar8 = cVar2;
      }
LAB_0016009d:
      if ((cVar8 != 'L') && (cVar8 != 'U')) {
        if (cVar8 == 'u') goto LAB_001600b7;
        local_38 = 0;
        if (!bVar11) goto LAB_00160134;
        goto LAB_00160115;
      }
      goto LAB_001600db;
    }
    lVar9 = 1;
LAB_00160065:
    local_38 = 0;
LAB_00160134:
    if (cVar2 != 'L') goto LAB_00160139;
LAB_0016019f:
    VARR_charpush(c2m_ctx->temp_string,(char)type);
    pcVar10 = ptVar5->repr;
  }
  else {
    if (cVar2 != 'u') {
      pcVar7 = ptVar3->repr;
      lVar9 = 0;
      bVar11 = false;
      cVar8 = *pcVar7;
      goto LAB_0016009d;
    }
    if (pcVar10[1] != '8') goto LAB_00160054;
    lVar9 = 2;
    pcVar7 = ptVar3->repr;
    cVar8 = *pcVar7;
    if (cVar8 == '\"') goto LAB_00160065;
    if (cVar8 != 'u') {
      bVar11 = true;
      goto LAB_0016009d;
    }
LAB_001600b7:
    cVar8 = 'u';
    if (pcVar7[1] == '8') {
      local_38 = 2;
      if ((cVar2 != '\"') && ((cVar2 != 'u' || (cVar2 = 'u', pcVar10[1] != '8')))) {
LAB_00160115:
        uVar1._0_4_ = (ptVar3->pos).lno;
        uVar1._4_4_ = (ptVar3->pos).ln_pos;
        error(c2m_ctx,0x18dd42,(ptVar3->pos).fname,uVar1);
        pcVar10 = ptVar5->repr;
        cVar2 = *pcVar10;
        goto LAB_00160134;
      }
    }
    else {
LAB_001600db:
      if (cVar2 != '\"') {
        if (cVar8 == cVar2) {
          local_38 = 1;
          if (pcVar10[1] != '8') goto LAB_00160134;
        }
        else {
          local_38 = 1;
        }
        goto LAB_00160115;
      }
      local_38 = 1;
      cVar2 = '\"';
    }
LAB_00160139:
    pcVar7 = ptVar3->repr;
    cVar8 = *pcVar7;
    if (((cVar8 == 'L') || (type = 0x55, cVar2 == 'U')) || (cVar8 == 'U')) goto LAB_0016019f;
    if (cVar2 == 'u') {
      if ((pcVar10[1] == '8') || ((type = 0x75, cVar8 == 'u' && (pcVar7[1] == '8')))) {
LAB_0016017c:
        VARR_charpush(c2m_ctx->temp_string,'u');
        type = 0x38;
      }
      goto LAB_0016019f;
    }
    if (cVar8 == 'u') {
      if (pcVar7[1] == '8') goto LAB_0016017c;
      type = 0x75;
      goto LAB_0016019f;
    }
    type = 0x20;
  }
  pcVar10 = pcVar10 + lVar9;
  while( true ) {
    if (*pcVar10 == '\0') break;
    VARR_charpush(c2m_ctx->temp_string,*pcVar10);
    pcVar10 = pcVar10 + 1;
  }
  cVar2 = VARR_charlast(c2m_ctx->temp_string);
  if (cVar2 != '\"') {
    __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
  }
  VARR_charpop(c2m_ctx->temp_string);
  pcVar10 = ptVar3->repr + local_38 + 1;
  while( true ) {
    if (*pcVar10 == '\0') break;
    VARR_charpush(c2m_ctx->temp_string,*pcVar10);
    pcVar10 = pcVar10 + 1;
  }
  cVar2 = VARR_charlast(c2m_ctx->temp_string);
  if (cVar2 != '\"') {
    __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
  }
  VARR_charpush(c2m_ctx->temp_string,'\0');
  pcVar10 = VARR_charaddr(c2m_ctx->temp_string);
  sVar12 = uniq_cstr(c2m_ctx,pcVar10);
  ptVar5->repr = sVar12.s;
  set_string_val(c2m_ctx,ptVar5,c2m_ctx->temp_string,type);
  ptVar3 = ptVar5;
LAB_00160037:
  VARR_token_tpush(c2m_ctx->recorded_tokens,ptVar3);
  return;
}

Assistant:

static void pre_out (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (t == NULL) {
    t = new_token (c2m_ctx, pre_last_token == NULL ? no_pos : pre_last_token->pos, "<EOF>",
                   T_EOFILE, N_IGNORE);
  } else {
    assert (t->code != T_EOU && t->code != EOF);
    pre_last_token = t;
    if ((t = pptoken2token (c2m_ctx, t, TRUE)) == NULL) return;
  }
  if (t->code == T_STR && VARR_LENGTH (token_t, recorded_tokens) != 0
      && VARR_LAST (token_t, recorded_tokens)->code == T_STR) { /* concat strings */
    token_t last_t = VARR_POP (token_t, recorded_tokens);
    int type = ' ', last_t_quot_off = 0, t_quot_off = 0, err_p = FALSE;
    const char *s;

    VARR_TRUNC (char, temp_string, 0);
    if (last_t->repr[0] == 'u' && last_t->repr[1] == '8') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != 'u' || t->repr[1] != '8');
      last_t_quot_off = 2;
    } else if (last_t->repr[0] == 'L' || last_t->repr[0] == 'u' || last_t->repr[0] == 'U') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || t->repr[1] == '8');
      last_t_quot_off = 1;
    }
    if (t->repr[0] == 'u' && t->repr[1] == '8') {
      err_p = last_t->repr[0] != '\"' && (last_t->repr[0] != 'u' || last_t->repr[1] != '8');
      t_quot_off = 2;
    } else if (t->repr[0] == 'L' || t->repr[0] == 'u' || t->repr[0] == 'U') {
      err_p = last_t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || last_t->repr[1] == '8');
      t_quot_off = 1;
    }
    if (err_p) error (c2m_ctx, t->pos, "concatenation of different type string literals");
    if (sizeof (mir_wchar) == 4 && (last_t->repr[0] == 'L' || t->repr[0] == 'L')) {
      type = 'L';
    } else if (last_t->repr[0] == 'U' || t->repr[0] == 'U') {
      type = 'U';
    } else if (last_t->repr[0] == 'L' || t->repr[0] == 'L') {
      type = 'L';
    } else if ((last_t->repr[0] == 'u' && last_t->repr[1] == '8')
               || (t->repr[0] == 'u' && t->repr[1] == '8')) {
      VARR_PUSH (char, temp_string, 'u');
      type = '8';
    } else if ((last_t->repr[0] == 'u' || t->repr[0] == 'u')) {
      type = 'u';
    }
    if (type != ' ') VARR_PUSH (char, temp_string, type);
    for (s = last_t->repr + last_t_quot_off; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_POP (char, temp_string);
    for (s = t->repr + t_quot_off + 1; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    t = last_t;
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_PUSH (char, temp_string, '\0');
    t->repr = uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
    set_string_val (c2m_ctx, t, temp_string, type);
  }
  VARR_PUSH (token_t, recorded_tokens, t);
}